

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall
adios2::core::Engine::DoPutDeferred(Engine *this,Variable<signed_char> *param_1,int8_t *param_2)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"DoPutDeferred",&local_31);
  ThrowUp(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Engine::DoPutStructSync(VariableStruct &, const void *) { ThrowUp("DoPutStructSync"); }